

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void set_snode_merge(lyxp_set *set1,lyxp_set *set2)

{
  lyxp_set_nodes *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  lyxp_node_type lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  lyxp_set_type lVar8;
  undefined4 uVar9;
  uint uVar10;
  lyxp_set_nodes *plVar11;
  LY_ERR *pLVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  
  if ((set1->type & ~LYXP_SET_SNODE_SET) == LYXP_SET_EMPTY) {
    if (set2->type != LYXP_SET_EMPTY) {
      if (set2->type != LYXP_SET_SNODE_SET) goto LAB_00161800;
      if (set1->type == LYXP_SET_EMPTY) {
        lVar8 = set2->type;
        uVar9 = *(undefined4 *)&set2->field_0x4;
        uVar2 = *(undefined8 *)&set2->field_0x8;
        plVar11 = (set2->val).nodes;
        uVar3 = *(undefined8 *)((long)&set2->val + 8);
        uVar5 = set2->size;
        uVar6 = set2->ctx_pos;
        uVar7 = set2->ctx_size;
        set1->used = set2->used;
        set1->size = uVar5;
        set1->ctx_pos = uVar6;
        set1->ctx_size = uVar7;
        (set1->val).nodes = plVar11;
        *(undefined8 *)((long)&set1->val + 8) = uVar3;
        set1->type = lVar8;
        *(undefined4 *)&set1->field_0x4 = uVar9;
        *(undefined8 *)&set1->field_0x8 = uVar2;
      }
      else {
        uVar10 = set1->used;
        uVar13 = set2->used + uVar10;
        if (set1->size < uVar13) {
          set1->size = uVar13;
          plVar11 = (lyxp_set_nodes *)ly_realloc((set1->val).nodes,(ulong)uVar13 << 4);
          (set1->val).nodes = plVar11;
          if (plVar11 == (lyxp_set_nodes *)0x0) {
            pLVar12 = ly_errno_location();
            *pLVar12 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_snode_merge");
            return;
          }
          uVar10 = set1->used;
        }
        uVar14 = (ulong)uVar10;
        for (uVar15 = 0; uVar15 < set2->used; uVar15 = uVar15 + 1) {
          lVar16 = 0;
          uVar17 = uVar14;
          while (uVar17 != 0) {
            if (*(lyd_node **)((long)&((set1->val).nodes)->node + lVar16) ==
                (set2->val).nodes[uVar15].node) {
              if ((int)uVar17 != 0) goto LAB_0016179e;
              break;
            }
            lVar16 = lVar16 + 0x10;
            uVar17 = uVar17 - 1;
          }
          plVar11 = (set2->val).nodes + uVar15;
          lVar4 = plVar11->type;
          uVar5 = plVar11->pos;
          plVar1 = (set1->val).nodes + uVar10;
          plVar1->node = plVar11->node;
          plVar1->type = lVar4;
          plVar1->pos = uVar5;
          uVar10 = set1->used + 1;
          set1->used = uVar10;
LAB_0016179e:
        }
        free((set2->val).nodes);
        set2->used = 0;
        set2->size = 0;
        set2->ctx_pos = 0;
        set2->ctx_size = 0;
        (set2->val).nodes = (lyxp_set_nodes *)0x0;
        *(undefined8 *)((long)&set2->val + 8) = 0;
        *(undefined8 *)set2 = 0;
        *(undefined8 *)&set2->field_0x8 = 0;
      }
    }
    return;
  }
LAB_00161800:
  __assert_fail("((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY)) && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                ,0x341,"void set_snode_merge(struct lyxp_set *, struct lyxp_set *)");
}

Assistant:

static void
set_snode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert(((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY))
        && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY)));

    if (set2->type == LYXP_SET_EMPTY) {
        return;
    }

    if (set1->type == LYXP_SET_EMPTY) {
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.snodes = ly_realloc(set1->val.snodes, set1->size * sizeof *set1->val.snodes);
        if (!set1->val.snodes) {
            LOGMEM;
            return;
        }
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.snodes[j].snode == set2->val.snodes[i].snode) {
                break;
            }
        }

        if (j == orig_used) {
            memcpy(&set1->val.snodes[set1->used], &set2->val.snodes[i], sizeof *set2->val.snodes);
            ++set1->used;
        }
    }

    free(set2->val.snodes);
    memset(set2, 0, sizeof *set2);
}